

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O2

bool __thiscall avro::MemoryInputStream::next(MemoryInputStream *this,uint8_t **data,size_t *len)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = maxLen(this);
  if (sVar2 != 0) {
    sVar1 = this->curLen_;
    *data = (this->data_->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start[this->cur_] + sVar1;
    *len = sVar2 - sVar1;
    this->curLen_ = sVar2;
  }
  return sVar2 != 0;
}

Assistant:

bool next(const uint8_t** data, size_t* len) {
        if (size_t n = maxLen()) {
            *data = data_[cur_] + curLen_;
            *len = n - curLen_;
            curLen_ = n;
            return true;
        }
        return false;
    }